

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Integer MA_sizeof_overhead(Integer datatype)

{
  ulong uVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  Integer IVar5;
  
  ma_stats.calls[0x1d] = ma_stats.calls[0x1d] + 1;
  ma_preinitialize("MA_sizeof_overhead");
  if (datatype - 1000U < 0x11) {
    piVar2 = ma_sizeof;
    iVar4 = 0;
    uVar3 = 0;
    for (uVar1 = 0; uVar1 != 0x11; uVar1 = uVar1 + 1) {
      if (iVar4 < *piVar2) {
        uVar3 = uVar1 & 0xffffffff;
        iVar4 = *piVar2;
      }
      piVar2 = piVar2 + 1;
    }
    iVar4 = *(int *)(datatype * 4 + 0x1d23b0);
    IVar5 = (Integer)(int)(((ma_sizeof[(int)uVar3] + 0x5e) / iVar4 + 1) -
                          (uint)((ma_sizeof[(int)uVar3] + 0x5e) % iVar4 == 0));
  }
  else {
    IVar5 = 0;
    sprintf(ma_ebuf,"invalid datatype: %ld",datatype);
    ma_error(EL_Fatal,ET_External,"MA_sizeof_overhead",ma_ebuf);
  }
  return IVar5;
}

Assistant:

public Integer MA_sizeof_overhead(Integer datatype) 
{
    int        overhead_bytes;    /* max bytes of overhead for any block */
    int        ceiling;    /* 1 iff ceiling alters result */
    int        max_sizeof;    /* max over i of ma_sizeof[i] */
    int        biggest_datatype=0; /* corresponds to max_sizeof */
    int        i;        /* loop index */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_sizeof_overhead]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return DONTCARE;
#endif /* VERIFY */

    /* preinitialize if necessary */
    ma_preinitialize("MA_sizeof_overhead");

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "invalid datatype: %ld",
            (size_t)datatype);
        ma_error(EL_Fatal, ET_External, "MA_sizeof_overhead", ma_ebuf);
        return DONTCARE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /* compute and return the result */
    for (max_sizeof = 0, i = 0; i < MT_NUMTYPES; i++)
        if (ma_sizeof[i] > max_sizeof)
        {
            max_sizeof = ma_sizeof[i];
            biggest_datatype = i;
        }
    overhead_bytes = max_block_overhead(biggest_datatype);
    ceiling = (overhead_bytes % ma_sizeof[datatype]) ? 1 : 0;
    return (Integer)((overhead_bytes / ma_sizeof[datatype]) + ceiling);
}